

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaAllocator_T::FreeDedicatedMemory(VmaAllocator_T *this,VmaAllocation allocation)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  uint uVar3;
  VmaAllocation pVVar4;
  VmaPool pVVar5;
  VkDeviceMemory *ppVVar6;
  VkDeviceMemory hMemory;
  VmaDedicatedAllocationList *this_00;
  
  uVar3 = allocation->m_MemoryTypeIndex;
  pVVar4 = allocation;
  if (allocation->m_Type == '\x02') {
LAB_001c34eb:
    pVVar5 = (pVVar4->field_0).m_DedicatedAllocation.m_hParentPool;
  }
  else {
    if (allocation->m_Type == '\x01') {
      pVVar4 = (VmaAllocation)
               &(((allocation->field_0).m_DedicatedAllocation.m_hParentPool)->m_BlockVector).
                m_hParentPool;
      goto LAB_001c34eb;
    }
    pVVar5 = (VmaPool)0x0;
  }
  this_00 = this->m_DedicatedAllocations + uVar3;
  if (pVVar5 != (VmaPool)0x0) {
    this_00 = &pVVar5->m_DedicatedAllocations;
  }
  VmaDedicatedAllocationList::Unregister(this_00,allocation);
  if (allocation->m_Type == '\x02') {
    ppVVar6 = &(allocation->field_0).m_DedicatedAllocation.m_hMemory;
  }
  else {
    if (allocation->m_Type != '\x01') {
      hMemory = (VkDeviceMemory)0x0;
      goto LAB_001c3536;
    }
    ppVVar6 = &((allocation->field_0).m_BlockAllocation.m_Block)->m_hMemory;
  }
  hMemory = *ppVVar6;
LAB_001c3536:
  FreeVulkanMemory(this,uVar3,allocation->m_Size,hMemory);
  uVar3 = (this->m_MemProps).memoryTypes[allocation->m_MemoryTypeIndex].heapIndex;
  LOCK();
  paVar2 = (this->m_Budget).m_AllocationBytes + uVar3;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i - allocation->m_Size;
  UNLOCK();
  LOCK();
  paVar1 = (this->m_Budget).m_AllocationCount + uVar3;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->m_Budget).m_OperationsSinceBudgetFetch;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  VmaAllocationObjectAllocator::Free(&this->m_AllocationObjectAllocator,allocation);
  return;
}

Assistant:

void VmaAllocator_T::FreeDedicatedMemory(const VmaAllocation allocation)
{
    VMA_ASSERT(allocation && allocation->GetType() == VmaAllocation_T::ALLOCATION_TYPE_DEDICATED);

    const uint32_t memTypeIndex = allocation->GetMemoryTypeIndex();
    VmaPool parentPool = allocation->GetParentPool();
    if(parentPool == VK_NULL_HANDLE)
    {
        // Default pool
        m_DedicatedAllocations[memTypeIndex].Unregister(allocation);
    }
    else
    {
        // Custom pool
        parentPool->m_DedicatedAllocations.Unregister(allocation);
    }

    VkDeviceMemory hMemory = allocation->GetMemory();

    /*
    There is no need to call this, because Vulkan spec allows to skip vkUnmapMemory
    before vkFreeMemory.

    if(allocation->GetMappedData() != VMA_NULL)
    {
        (*m_VulkanFunctions.vkUnmapMemory)(m_hDevice, hMemory);
    }
    */

    FreeVulkanMemory(memTypeIndex, allocation->GetSize(), hMemory);

    m_Budget.RemoveAllocation(MemoryTypeIndexToHeapIndex(allocation->GetMemoryTypeIndex()), allocation->GetSize());
    m_AllocationObjectAllocator.Free(allocation);

    VMA_DEBUG_LOG("    Freed DedicatedMemory MemoryTypeIndex=%u", memTypeIndex);
}